

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRleCompressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::RleCompressor::uncompress
          (RleCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  long lVar1;
  char *pcVar2;
  InputExc *this_00;
  undefined1 *puVar3;
  int in_EDX;
  undefined1 *puVar4;
  long in_RDI;
  undefined8 *in_R8;
  char *stop_1;
  char *s;
  char *t2;
  char *t1;
  int d;
  uchar *stop;
  uchar *t;
  int outSize;
  char *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 *puVar5;
  int in_stack_ffffffffffffffb0;
  undefined1 *puVar6;
  char *local_38;
  int local_4;
  
  if (in_EDX == 0) {
    *in_R8 = *(undefined8 *)(in_RDI + 0x20);
    local_4 = 0;
  }
  else {
    local_4 = rleUncompress(in_stack_ffffffffffffffb0,
                            (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                            in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (local_4 == 0) {
      this_00 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(this_00,"Data decoding (rle) failed.");
      __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    lVar1 = *(long *)(in_RDI + 0x18);
    pcVar2 = *(char **)(in_RDI + 0x18);
    while (local_38 = pcVar2 + 1, local_38 < (char *)(lVar1 + local_4)) {
      *local_38 = *pcVar2 + *local_38 + -0x80;
      pcVar2 = local_38;
    }
    puVar4 = *(undefined1 **)(in_RDI + 0x20);
    puVar3 = puVar4 + local_4;
    puVar5 = (undefined1 *)(*(long *)(in_RDI + 0x18) + (long)((local_4 + 1) / 2));
    puVar6 = *(undefined1 **)(in_RDI + 0x18);
    for (; puVar4 < puVar3; puVar4 = puVar4 + 2) {
      *puVar4 = *puVar6;
      if (puVar3 <= puVar4 + 1) break;
      puVar4[1] = *puVar5;
      puVar5 = puVar5 + 1;
      puVar6 = puVar6 + 1;
    }
    *in_R8 = *(undefined8 *)(in_RDI + 0x20);
  }
  return local_4;
}

Assistant:

int
RleCompressor::uncompress (const char *inPtr,
			   int inSize,
			   int minY,
			   const char *&outPtr)
{
    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    //
    // Decode the run-length encoded data
    //

    int outSize;

    if (0 == (outSize = rleUncompress (inSize, _maxScanLineSize,
				       (const signed char *) inPtr,
				       _tmpBuffer)))
    {
	throw IEX_NAMESPACE::InputExc ("Data decoding (rle) failed.");
    }

    //
    // Predictor.
    //

    {
	unsigned char *t = (unsigned char *) _tmpBuffer + 1;
	unsigned char *stop = (unsigned char *) _tmpBuffer + outSize;

	while (t < stop)
	{
	    int d = int (t[-1]) + int (t[0]) - 128;
	    t[0] = d;
	    ++t;
	}
    }

    //
    // Reorder the pixel data.
    //

    {
	const char *t1 = _tmpBuffer;
	const char *t2 = _tmpBuffer + (outSize + 1) / 2;
	char *s = _outBuffer;
	char *stop = s + outSize;

	while (true)
	{
	    if (s < stop)
		*(s++) = *(t1++);
	    else
		break;

	    if (s < stop)
		*(s++) = *(t2++);
	    else
		break;
	}
    }

    outPtr = _outBuffer;
    return outSize;
}